

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::EndLocalDecls(BinaryReaderInterp *this)

{
  FuncDesc *pFVar1;
  uint uVar2;
  ValueType VVar3;
  int iVar4;
  Index i;
  uint uVar5;
  HandlerDesc local_58;
  
  if (this->local_count_ != 0) {
    Istream::Emit(this->istream_,InterpAlloca,this->local_count_);
    iVar4 = 0;
    for (uVar5 = 0; uVar5 < this->local_count_; uVar5 = uVar5 + 1) {
      pFVar1 = this->func_;
      VVar3 = FuncDesc::GetLocalType
                        (pFVar1,(int)((ulong)((long)(pFVar1->type).params.
                                                                                                        
                                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)(pFVar1->type).params.
                                                                                                      
                                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                                uVar5);
      uVar2 = VVar3.enum_ + 0x17;
      if ((uVar2 < 8) && ((0xc5U >> (uVar2 & 0x1f) & 1) != 0)) {
        Istream::Emit(this->istream_,InterpMarkRef,this->local_count_ + iVar4);
      }
      iVar4 = iVar4 + -1;
    }
  }
  pFVar1 = this->func_;
  local_58.kind = Catch;
  local_58.try_start_offset = Istream::end(this->istream_);
  local_58.try_end_offset = 0xffffffff;
  local_58.catches.
  super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.catches.
  super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.catches.
  super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.field_4.catch_all_offset = 0xffffffff;
  local_58.values = this->local_count_;
  local_58.exceptions = 0;
  local_58.catch_all_ref = false;
  std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::
  emplace_back<wabt::interp::HandlerDesc>(&pFVar1->handlers,&local_58);
  std::_Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>::
  ~_Vector_base(&local_58.catches.
                 super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
               );
  return (Result)Ok;
}

Assistant:

Result BinaryReaderInterp::EndLocalDecls() {
  if (local_count_ != 0) {
    istream_.Emit(Opcode::InterpAlloca, local_count_);
    for (Index i = 0; i < local_count_; i++) {
      if (func_->GetLocalType(func_->type.params.size() + i).IsRef()) {
        istream_.Emit(Opcode::InterpMarkRef, local_count_ - i);
      }
    }
  }
  // Continuation of the implicit func label, used for exception handling. (See
  // BeginFunctionBody.)
  // We need the local count for this, which is only available after processing
  // all local decls.
  // NOTE: we don't count the parameters, as they're not part of the frame.
  func_->handlers.push_back(HandlerDesc{HandlerKind::Catch,
                                        istream_.end(),
                                        Istream::kInvalidOffset,
                                        {},
                                        {Istream::kInvalidOffset},
                                        static_cast<u32>(local_count_),
                                        0});

  return Result::Ok;
}